

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.c
# Opt level: O1

int wally_addr_segwit_n_get_version
              (char *addr,size_t addr_len,char *addr_family,size_t addr_family_len,uint32_t flags,
              size_t *written)

{
  _Bool _Var1;
  int iVar2;
  uchar witness_program [42];
  
  iVar2 = wally_addr_segwit_n_to_bytes
                    (addr,addr_len,addr_family,addr_family_len,flags,witness_program,0x2a,written);
  if (iVar2 == 0) {
    _Var1 = script_is_op_n(witness_program[0],true,written);
    iVar2 = 0;
    if (!_Var1) {
      *written = 0;
      iVar2 = -2;
    }
  }
  return iVar2;
}

Assistant:

int wally_addr_segwit_n_get_version(const char *addr, size_t addr_len,
                                    const char *addr_family, size_t addr_family_len,
                                    uint32_t flags, size_t *written)
{
    unsigned char witness_program[WALLY_WITNESSSCRIPT_MAX_LEN];
    int ret = wally_addr_segwit_n_to_bytes(addr, addr_len, addr_family, addr_family_len,
                                           flags, witness_program, sizeof(witness_program),
                                           written);
    if (ret == WALLY_OK && !script_is_op_n(witness_program[0], true, written)) {
        *written = 0;
        ret = WALLY_EINVAL;
    }
    return ret;
}